

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O2

Contrib_List *
crnlib::Resampler::make_clist
          (int src_x,int dst_x,Boundary_Op boundary_op,_func_Resample_Real_Resample_Real *Pfilter,
          Resample_Real filter_support,Resample_Real filter_scale,Resample_Real src_ofs)

{
  Contrib_List *pCVar1;
  ushort uVar2;
  int iVar3;
  Contrib *pCVar4;
  float fVar5;
  int iVar6;
  Contrib_List *p;
  Contrib_List *pCVar7;
  Contrib *p_00;
  uint uVar8;
  ulong uVar9;
  Contrib_List *pCVar10;
  int iVar11;
  uint uVar12;
  Contrib_List *pCVar13;
  int iVar14;
  ulong uVar15;
  undefined8 *puVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  Resample_Real RVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  Contrib *local_78;
  Contrib *local_68;
  
  p = (Contrib_List *)crnlib_calloc((long)dst_x,0x10,(size_t *)0x0);
  if (p == (Contrib_List *)0x0) {
    return (Contrib_List *)0x0;
  }
  pCVar7 = (Contrib_List *)crnlib_calloc((long)dst_x,0xc,(size_t *)0x0);
  pCVar10 = (Contrib_List *)0x0;
  pCVar13 = p;
  if (pCVar7 == (Contrib_List *)0x0) goto LAB_00134c48;
  fVar23 = 1.0 / filter_scale;
  fVar24 = (float)dst_x / (float)src_x;
  pCVar10 = p;
  pCVar13 = pCVar7;
  if (1.0 <= fVar24) {
    uVar9 = 0;
    uVar15 = (ulong)(uint)dst_x;
    if (dst_x < 1) {
      uVar15 = uVar9;
    }
    puVar16 = (undefined8 *)&pCVar7->field_0x4;
    iVar14 = 0;
    for (; uVar15 != uVar9; uVar9 = uVar9 + 1) {
      fVar17 = ((float)(int)uVar9 + 0.5) / fVar24 + -0.5 + src_ofs;
      fVar18 = floorf(fVar17 - filter_support * filter_scale);
      fVar19 = ceilf(filter_support * filter_scale + fVar17);
      *(float *)((long)puVar16 + -4) = fVar17;
      *puVar16 = CONCAT44((int)fVar19,(int)fVar18);
      iVar14 = (iVar14 - (int)fVar18) + (int)fVar19 + 1;
      puVar16 = (undefined8 *)((long)puVar16 + 0xc);
    }
    if ((iVar14 != 0) &&
       (p_00 = (Contrib *)crnlib_calloc((long)iVar14,8,(size_t *)0x0), p_00 != (Contrib *)0x0)) {
      local_68 = p_00;
      for (uVar9 = 0; uVar9 != uVar15; uVar9 = uVar9 + 1) {
        fVar24 = *(float *)(&pCVar7->n + uVar9 * 6);
        iVar14 = *(int *)(&pCVar7->field_0x4 + uVar9 * 0xc);
        iVar3 = *(int *)((long)&pCVar7->p + uVar9 * 0xc);
        p[uVar9].n = 0;
        pCVar1 = p + uVar9;
        p[uVar9].p = local_68;
        iVar6 = iVar3 - iVar14;
        fVar17 = 0.0;
        for (iVar11 = iVar14; iVar11 <= iVar3; iVar11 = iVar11 + 1) {
          RVar21 = (*Pfilter)((fVar24 - (float)iVar11) * fVar23);
          fVar17 = fVar17 + RVar21;
        }
        fVar19 = 0.0;
        fVar18 = -1e+20;
        uVar12 = 0xffffffff;
        for (; iVar14 <= iVar3; iVar14 = iVar14 + 1) {
          RVar21 = (*Pfilter)((fVar24 - (float)iVar14) * fVar23);
          fVar20 = RVar21 * (1.0 / fVar17);
          if ((fVar20 != 0.0) || (fVar22 = fVar18, uVar8 = uVar12, NAN(fVar20))) {
            iVar11 = reflect(iVar14,src_x,boundary_op);
            uVar2 = pCVar1->n;
            pCVar1->n = uVar2 + 1;
            pCVar4 = pCVar1->p;
            pCVar4[uVar2].pixel = (unsigned_short)iVar11;
            pCVar4[uVar2].weight = fVar20;
            fVar19 = fVar19 + fVar20;
            fVar22 = fVar20;
            uVar8 = (uint)uVar2;
            if (fVar20 <= fVar18) {
              fVar22 = fVar18;
              uVar8 = uVar12;
            }
          }
          fVar18 = fVar22;
          uVar12 = uVar8;
        }
        if ((uVar12 == 0xffffffff) || (pCVar1->n == 0)) goto LAB_00134c32;
        if ((fVar19 != 1.0) || (NAN(fVar19))) {
          pCVar1->p[uVar12].weight = (1.0 - fVar19) + pCVar1->p[uVar12].weight;
        }
        local_68 = local_68 + (iVar6 + 1);
      }
      goto LAB_00134c48;
    }
  }
  else {
    fVar17 = (filter_support / fVar24) * filter_scale;
    uVar9 = 0;
    uVar15 = (ulong)(uint)dst_x;
    if (dst_x < 1) {
      uVar15 = uVar9;
    }
    puVar16 = (undefined8 *)&pCVar7->field_0x4;
    iVar14 = 0;
    for (; uVar15 != uVar9; uVar9 = uVar9 + 1) {
      fVar18 = ((float)(int)uVar9 + 0.5) / fVar24 + -0.5 + src_ofs;
      fVar19 = floorf(fVar18 - fVar17);
      fVar20 = ceilf(fVar17 + fVar18);
      *(float *)((long)puVar16 + -4) = fVar18;
      *puVar16 = CONCAT44((int)fVar20,(int)fVar19);
      iVar14 = (iVar14 - (int)fVar19) + (int)fVar20 + 1;
      puVar16 = (undefined8 *)((long)puVar16 + 0xc);
    }
    if ((iVar14 != 0) &&
       (p_00 = (Contrib *)crnlib_calloc((long)iVar14,8,(size_t *)0x0), p_00 != (Contrib *)0x0)) {
      local_78 = p_00;
      for (uVar9 = 0; uVar9 != uVar15; uVar9 = uVar9 + 1) {
        fVar17 = *(float *)(&pCVar7->n + uVar9 * 6);
        iVar14 = *(int *)(&pCVar7->field_0x4 + uVar9 * 0xc);
        iVar3 = *(int *)((long)&pCVar7->p + uVar9 * 0xc);
        p[uVar9].n = 0;
        pCVar1 = p + uVar9;
        p[uVar9].p = local_78;
        iVar6 = iVar3 - iVar14;
        fVar18 = 0.0;
        for (iVar11 = iVar14; iVar11 <= iVar3; iVar11 = iVar11 + 1) {
          RVar21 = (*Pfilter)((fVar17 - (float)iVar11) * fVar24 * fVar23);
          fVar18 = fVar18 + RVar21;
        }
        fVar20 = 0.0;
        fVar19 = -1e+20;
        uVar12 = 0xffffffff;
        for (; iVar14 <= iVar3; iVar14 = iVar14 + 1) {
          RVar21 = (*Pfilter)((fVar17 - (float)iVar14) * fVar24 * fVar23);
          fVar22 = RVar21 * (1.0 / fVar18);
          if ((fVar22 != 0.0) || (fVar5 = fVar19, uVar8 = uVar12, NAN(fVar22))) {
            iVar11 = reflect(iVar14,src_x,boundary_op);
            uVar2 = pCVar1->n;
            pCVar1->n = uVar2 + 1;
            pCVar4 = pCVar1->p;
            pCVar4[uVar2].pixel = (unsigned_short)iVar11;
            pCVar4[uVar2].weight = fVar22;
            fVar20 = fVar20 + fVar22;
            fVar5 = fVar22;
            uVar8 = (uint)uVar2;
            if (fVar22 <= fVar19) {
              fVar5 = fVar19;
              uVar8 = uVar12;
            }
          }
          fVar19 = fVar5;
          uVar12 = uVar8;
        }
        if ((uVar12 == 0xffffffff) || (pCVar1->n == 0)) goto LAB_00134c32;
        if ((fVar20 != 1.0) || (NAN(fVar20))) {
          pCVar1->p[uVar12].weight = (1.0 - fVar20) + pCVar1->p[uVar12].weight;
        }
        local_78 = local_78 + (iVar6 + 1);
      }
      goto LAB_00134c48;
    }
  }
LAB_00134c3c:
  crnlib_free(p);
  pCVar10 = (Contrib_List *)0x0;
LAB_00134c48:
  crnlib_free(pCVar13);
  return pCVar10;
LAB_00134c32:
  crnlib_free(p_00);
  goto LAB_00134c3c;
}

Assistant:

Resampler::Contrib_List* Resampler::make_clist(
        int src_x, int dst_x, Boundary_Op boundary_op,
        Resample_Real (*Pfilter)(Resample_Real),
        Resample_Real filter_support,
        Resample_Real filter_scale,
        Resample_Real src_ofs)
    {
        typedef struct
        {
            // The center of the range in DISCRETE coordinates (pixel center = 0.0f).
            Resample_Real center;
            int left, right;
        } Contrib_Bounds;

        int i, j, k, n, left, right;
        Resample_Real total_weight;
        Resample_Real xscale, center, half_width, weight;
        Contrib_List* Pcontrib;
        Contrib* Pcpool;
        Contrib* Pcpool_next;
        Contrib_Bounds* Pcontrib_bounds;

        if ((Pcontrib = (Contrib_List*)crnlib_calloc(dst_x, sizeof(Contrib_List))) == nullptr)
        {
            return nullptr;
        }

        Pcontrib_bounds = (Contrib_Bounds*)crnlib_calloc(dst_x, sizeof(Contrib_Bounds));
        if (!Pcontrib_bounds)
        {
            crnlib_free(Pcontrib);
            return (nullptr);
        }

        const Resample_Real oo_filter_scale = 1.0f / filter_scale;

        const Resample_Real NUDGE = 0.5f;
        xscale = dst_x / (Resample_Real)src_x;

        if (xscale < 1.0f)
        {
            int total;
            (void)total;

            /* Handle case when there are fewer destination
         * samples than source samples (downsampling/minification).
         */

            // stretched half width of filter
            half_width = (filter_support / xscale) * filter_scale;

            // Find the range of source sample(s) that will contribute to each destination sample.

            for (i = 0, n = 0; i < dst_x; i++)
            {
                // Convert from discrete to continuous coordinates, scale, then convert back to discrete.
                center = ((Resample_Real)i + NUDGE) / xscale;
                center -= NUDGE;
                center += src_ofs;

                left = cast_to_int((Resample_Real)floor(center - half_width));
                right = cast_to_int((Resample_Real)ceil(center + half_width));

                Pcontrib_bounds[i].center = center;
                Pcontrib_bounds[i].left = left;
                Pcontrib_bounds[i].right = right;

                n += (right - left + 1);
            }

            /* Allocate memory for contributors. */

            if ((n == 0) || ((Pcpool = (Contrib*)crnlib_calloc(n, sizeof(Contrib))) == nullptr))
            {
                crnlib_free(Pcontrib);
                crnlib_free(Pcontrib_bounds);
                return nullptr;
            }
            total = n;

            Pcpool_next = Pcpool;

            /* Create the list of source samples which
         * contribute to each destination sample.
         */

            for (i = 0; i < dst_x; i++)
            {
                int max_k = -1;
                Resample_Real max_w = -1e+20f;

                center = Pcontrib_bounds[i].center;
                left = Pcontrib_bounds[i].left;
                right = Pcontrib_bounds[i].right;

                Pcontrib[i].n = 0;
                Pcontrib[i].p = Pcpool_next;
                Pcpool_next += (right - left + 1);
                resampler_assert((Pcpool_next - Pcpool) <= total);

                total_weight = 0;

                for (j = left; j <= right; j++)
                {
                    total_weight += (*Pfilter)((center - (Resample_Real)j) * xscale * oo_filter_scale);
                }
                const Resample_Real norm = static_cast<Resample_Real>(1.0f / total_weight);

                total_weight = 0;

#if RESAMPLER_DEBUG
                printf("%i: ", i);
#endif

                for (j = left; j <= right; j++)
                {
                    weight = (*Pfilter)((center - (Resample_Real)j) * xscale * oo_filter_scale) * norm;
                    if (weight == 0.0f)
                    {
                        continue;
                    }

                    n = reflect(j, src_x, boundary_op);

#if RESAMPLER_DEBUG
                    printf("%i(%f), ", n, weight);
#endif

                    /* Increment the number of source
               * samples which contribute to the
               * current destination sample.
               */

                    k = Pcontrib[i].n++;

                    Pcontrib[i].p[k].pixel = (unsigned short)n; /* store src sample number */
                    Pcontrib[i].p[k].weight = weight; /* store src sample weight */

                    total_weight += weight; /* total weight of all contributors */

                    if (weight > max_w)
                    {
                        max_w = weight;
                        max_k = k;
                    }
                }

#if RESAMPLER_DEBUG
                printf("\n\n");
#endif

                //resampler_assert(Pcontrib[i].n);
                //resampler_assert(max_k != -1);
                if ((max_k == -1) || (Pcontrib[i].n == 0))
                {
                    crnlib_free(Pcpool);
                    crnlib_free(Pcontrib);
                    crnlib_free(Pcontrib_bounds);
                    return nullptr;
                }

                if (total_weight != 1.0f)
                {
                    Pcontrib[i].p[max_k].weight += 1.0f - total_weight;
                }
            }
        }
        else
        {
            /* Handle case when there are more
         * destination samples than source
         * samples (upsampling).
         */

            half_width = filter_support * filter_scale;

            // Find the source sample(s) that contribute to each destination sample.

            for (i = 0, n = 0; i < dst_x; i++)
            {
                // Convert from discrete to continuous coordinates, scale, then convert back to discrete.
                center = ((Resample_Real)i + NUDGE) / xscale;
                center -= NUDGE;
                center += src_ofs;

                left = cast_to_int((Resample_Real)floor(center - half_width));
                right = cast_to_int((Resample_Real)ceil(center + half_width));

                Pcontrib_bounds[i].center = center;
                Pcontrib_bounds[i].left = left;
                Pcontrib_bounds[i].right = right;

                n += (right - left + 1);
            }

            /* Allocate memory for contributors. */

            int total = n;
            if ((total == 0) || ((Pcpool = (Contrib*)crnlib_calloc(total, sizeof(Contrib))) == nullptr))
            {
                crnlib_free(Pcontrib);
                crnlib_free(Pcontrib_bounds);
                return nullptr;
            }

            Pcpool_next = Pcpool;

            /* Create the list of source samples which
         * contribute to each destination sample.
         */

            for (i = 0; i < dst_x; i++)
            {
                int max_k = -1;
                Resample_Real max_w = -1e+20f;

                center = Pcontrib_bounds[i].center;
                left = Pcontrib_bounds[i].left;
                right = Pcontrib_bounds[i].right;

                Pcontrib[i].n = 0;
                Pcontrib[i].p = Pcpool_next;
                Pcpool_next += (right - left + 1);
                resampler_assert((Pcpool_next - Pcpool) <= total);

                total_weight = 0;
                for (j = left; j <= right; j++)
                {
                    total_weight += (*Pfilter)((center - (Resample_Real)j) * oo_filter_scale);
                }

                const Resample_Real norm = static_cast<Resample_Real>(1.0f / total_weight);

                total_weight = 0;

#if RESAMPLER_DEBUG
                printf("%i: ", i);
#endif

                for (j = left; j <= right; j++)
                {
                    weight = (*Pfilter)((center - (Resample_Real)j) * oo_filter_scale) * norm;
                    if (weight == 0.0f)
                    {
                        continue;
                    }

                    n = reflect(j, src_x, boundary_op);

#if RESAMPLER_DEBUG
                    printf("%i(%f), ", n, weight);
#endif

                    /* Increment the number of source
               * samples which contribute to the
               * current destination sample.
               */

                    k = Pcontrib[i].n++;

                    Pcontrib[i].p[k].pixel = (unsigned short)n; /* store src sample number */
                    Pcontrib[i].p[k].weight = weight; /* store src sample weight */

                    total_weight += weight; /* total weight of all contributors */

                    if (weight > max_w)
                    {
                        max_w = weight;
                        max_k = k;
                    }
                }

#if RESAMPLER_DEBUG
                printf("\n\n");
#endif

                //resampler_assert(Pcontrib[i].n);
                //resampler_assert(max_k != -1);

                if ((max_k == -1) || (Pcontrib[i].n == 0))
                {
                    crnlib_free(Pcpool);
                    crnlib_free(Pcontrib);
                    crnlib_free(Pcontrib_bounds);
                    return nullptr;
                }

                if (total_weight != 1.0f)
                {
                    Pcontrib[i].p[max_k].weight += 1.0f - total_weight;
                }
            }
        }

#if RESAMPLER_DEBUG
        printf("*******\n");
#endif

        crnlib_free(Pcontrib_bounds);

        return Pcontrib;
    }